

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrFragmentOperations.cpp
# Opt level: O3

void __thiscall
rr::FragmentProcessor::executeBlendFactorComputeA
          (FragmentProcessor *this,Vec4 *blendColor,BlendState *blendAState)

{
  long lVar1;
  
  switch(blendAState->srcFunc) {
  case BLENDFUNC_ZERO:
    lVar1 = 0x40;
    do {
      if (*(char *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar1 + -0x44) ==
          '\x01') {
        *(undefined4 *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar1 + -4) =
             0;
      }
      lVar1 = lVar1 + 0x84;
    } while (lVar1 != 0x2140);
    break;
  case BLENDFUNC_ONE:
    lVar1 = 0x40;
    do {
      if (*(char *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar1 + -0x44) ==
          '\x01') {
        *(undefined4 *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar1 + -4) =
             0x3f800000;
      }
      lVar1 = lVar1 + 0x84;
    } while (lVar1 != 0x2140);
    break;
  case BLENDFUNC_SRC_COLOR:
    lVar1 = 0;
    do {
      if (*(char *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar1 + -4) ==
          '\x01') {
        *(undefined4 *)((long)this->m_sampleRegister[0].blendDstFactorRGB.m_data + lVar1 + -4) =
             *(undefined4 *)
              ((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar1 + 0xc);
      }
      lVar1 = lVar1 + 0x84;
    } while (lVar1 != 0x2100);
    break;
  case BLENDFUNC_ONE_MINUS_SRC_COLOR:
    lVar1 = 0;
    do {
      if (*(char *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar1 + -4) ==
          '\x01') {
        *(float *)((long)this->m_sampleRegister[0].blendDstFactorRGB.m_data + lVar1 + -4) =
             1.0 - *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                             lVar1 + 0xc);
      }
      lVar1 = lVar1 + 0x84;
    } while (lVar1 != 0x2100);
    break;
  case BLENDFUNC_DST_COLOR:
    lVar1 = 0x40;
    do {
      if (*(char *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar1 + -0x44) ==
          '\x01') {
        *(undefined4 *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar1 + -4) =
             *(undefined4 *)
              ((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar1 + -0x14);
      }
      lVar1 = lVar1 + 0x84;
    } while (lVar1 != 0x2140);
    break;
  case BLENDFUNC_ONE_MINUS_DST_COLOR:
    lVar1 = 0x40;
    do {
      if (*(char *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar1 + -0x44) ==
          '\x01') {
        *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar1 + -4) =
             1.0 - *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                             lVar1 + -0x14);
      }
      lVar1 = lVar1 + 0x84;
    } while (lVar1 != 0x2140);
    break;
  case BLENDFUNC_SRC_ALPHA:
    lVar1 = 0;
    do {
      if (*(char *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar1 + -4) ==
          '\x01') {
        *(undefined4 *)((long)this->m_sampleRegister[0].blendDstFactorRGB.m_data + lVar1 + -4) =
             *(undefined4 *)
              ((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar1 + 0xc);
      }
      lVar1 = lVar1 + 0x84;
    } while (lVar1 != 0x2100);
    break;
  case BLENDFUNC_ONE_MINUS_SRC_ALPHA:
    lVar1 = 0;
    do {
      if (*(char *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar1 + -4) ==
          '\x01') {
        *(float *)((long)this->m_sampleRegister[0].blendDstFactorRGB.m_data + lVar1 + -4) =
             1.0 - *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                             lVar1 + 0xc);
      }
      lVar1 = lVar1 + 0x84;
    } while (lVar1 != 0x2100);
    break;
  case BLENDFUNC_DST_ALPHA:
    lVar1 = 0x40;
    do {
      if (*(char *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar1 + -0x44) ==
          '\x01') {
        *(undefined4 *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar1 + -4) =
             *(undefined4 *)
              ((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar1 + -0x14);
      }
      lVar1 = lVar1 + 0x84;
    } while (lVar1 != 0x2140);
    break;
  case BLENDFUNC_ONE_MINUS_DST_ALPHA:
    lVar1 = 0x40;
    do {
      if (*(char *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar1 + -0x44) ==
          '\x01') {
        *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar1 + -4) =
             1.0 - *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                             lVar1 + -0x14);
      }
      lVar1 = lVar1 + 0x84;
    } while (lVar1 != 0x2140);
    break;
  case BLENDFUNC_CONSTANT_COLOR:
    lVar1 = 0x40;
    do {
      if (*(char *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar1 + -0x44) ==
          '\x01') {
        *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar1 + -4) =
             blendColor->m_data[3];
      }
      lVar1 = lVar1 + 0x84;
    } while (lVar1 != 0x2140);
    break;
  case BLENDFUNC_ONE_MINUS_CONSTANT_COLOR:
    lVar1 = 0x40;
    do {
      if (*(char *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar1 + -0x44) ==
          '\x01') {
        *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar1 + -4) =
             1.0 - blendColor->m_data[3];
      }
      lVar1 = lVar1 + 0x84;
    } while (lVar1 != 0x2140);
    break;
  case BLENDFUNC_CONSTANT_ALPHA:
    lVar1 = 0x40;
    do {
      if (*(char *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar1 + -0x44) ==
          '\x01') {
        *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar1 + -4) =
             blendColor->m_data[3];
      }
      lVar1 = lVar1 + 0x84;
    } while (lVar1 != 0x2140);
    break;
  case BLENDFUNC_ONE_MINUS_CONSTANT_ALPHA:
    lVar1 = 0x40;
    do {
      if (*(char *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar1 + -0x44) ==
          '\x01') {
        *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar1 + -4) =
             1.0 - blendColor->m_data[3];
      }
      lVar1 = lVar1 + 0x84;
    } while (lVar1 != 0x2140);
    break;
  case BLENDFUNC_SRC_ALPHA_SATURATE:
    lVar1 = 0x40;
    do {
      if (*(char *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar1 + -0x44) ==
          '\x01') {
        *(undefined4 *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar1 + -4) =
             0x3f800000;
      }
      lVar1 = lVar1 + 0x84;
    } while (lVar1 != 0x2140);
    break;
  case BLENDFUNC_SRC1_COLOR:
    lVar1 = 0x40;
    do {
      if (*(char *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar1 + -0x44) ==
          '\x01') {
        *(undefined4 *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar1 + -4) =
             *(undefined4 *)
              ((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar1 + -0x24);
      }
      lVar1 = lVar1 + 0x84;
    } while (lVar1 != 0x2140);
    break;
  case BLENDFUNC_ONE_MINUS_SRC1_COLOR:
    lVar1 = 0x40;
    do {
      if (*(char *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar1 + -0x44) ==
          '\x01') {
        *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar1 + -4) =
             1.0 - *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                             lVar1 + -0x24);
      }
      lVar1 = lVar1 + 0x84;
    } while (lVar1 != 0x2140);
    break;
  case BLENDFUNC_SRC1_ALPHA:
    lVar1 = 0x40;
    do {
      if (*(char *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar1 + -0x44) ==
          '\x01') {
        *(undefined4 *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar1 + -4) =
             *(undefined4 *)
              ((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar1 + -0x24);
      }
      lVar1 = lVar1 + 0x84;
    } while (lVar1 != 0x2140);
    break;
  case BLENDFUNC_ONE_MINUS_SRC1_ALPHA:
    lVar1 = 0x40;
    do {
      if (*(char *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar1 + -0x44) ==
          '\x01') {
        *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar1 + -4) =
             1.0 - *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                             lVar1 + -0x24);
      }
      lVar1 = lVar1 + 0x84;
    } while (lVar1 != 0x2140);
  }
  switch(blendAState->dstFunc) {
  case BLENDFUNC_ZERO:
    lVar1 = 0;
    do {
      if (*(char *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar1 + -4) ==
          '\x01') {
        *(undefined4 *)((long)this->m_sampleRegister[0].blendedRGB.m_data + lVar1 + -4) = 0;
      }
      lVar1 = lVar1 + 0x84;
    } while (lVar1 != 0x2100);
    break;
  case BLENDFUNC_ONE:
    lVar1 = 0;
    do {
      if (*(char *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar1 + -4) ==
          '\x01') {
        *(undefined4 *)((long)this->m_sampleRegister[0].blendedRGB.m_data + lVar1 + -4) = 0x3f800000
        ;
      }
      lVar1 = lVar1 + 0x84;
    } while (lVar1 != 0x2100);
    break;
  case BLENDFUNC_SRC_COLOR:
    lVar1 = 0;
    do {
      if (*(char *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar1 + -4) ==
          '\x01') {
        *(undefined4 *)((long)this->m_sampleRegister[0].blendedRGB.m_data + lVar1 + -4) =
             *(undefined4 *)
              ((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar1 + 0xc);
      }
      lVar1 = lVar1 + 0x84;
    } while (lVar1 != 0x2100);
    break;
  case BLENDFUNC_ONE_MINUS_SRC_COLOR:
    lVar1 = 0;
    do {
      if (*(char *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar1 + -4) ==
          '\x01') {
        *(float *)((long)this->m_sampleRegister[0].blendedRGB.m_data + lVar1 + -4) =
             1.0 - *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                             lVar1 + 0xc);
      }
      lVar1 = lVar1 + 0x84;
    } while (lVar1 != 0x2100);
    break;
  case BLENDFUNC_DST_COLOR:
    lVar1 = 0x50;
    do {
      if (*(char *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar1 + -0x54) ==
          '\x01') {
        *(undefined4 *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar1 + -4) =
             *(undefined4 *)
              ((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar1 + -0x24);
      }
      lVar1 = lVar1 + 0x84;
    } while (lVar1 != 0x2150);
    break;
  case BLENDFUNC_ONE_MINUS_DST_COLOR:
    lVar1 = 0x50;
    do {
      if (*(char *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar1 + -0x54) ==
          '\x01') {
        *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar1 + -4) =
             1.0 - *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                             lVar1 + -0x24);
      }
      lVar1 = lVar1 + 0x84;
    } while (lVar1 != 0x2150);
    break;
  case BLENDFUNC_SRC_ALPHA:
    lVar1 = 0;
    do {
      if (*(char *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar1 + -4) ==
          '\x01') {
        *(undefined4 *)((long)this->m_sampleRegister[0].blendedRGB.m_data + lVar1 + -4) =
             *(undefined4 *)
              ((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar1 + 0xc);
      }
      lVar1 = lVar1 + 0x84;
    } while (lVar1 != 0x2100);
    break;
  case BLENDFUNC_ONE_MINUS_SRC_ALPHA:
    lVar1 = 0;
    do {
      if (*(char *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar1 + -4) ==
          '\x01') {
        *(float *)((long)this->m_sampleRegister[0].blendedRGB.m_data + lVar1 + -4) =
             1.0 - *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                             lVar1 + 0xc);
      }
      lVar1 = lVar1 + 0x84;
    } while (lVar1 != 0x2100);
    break;
  case BLENDFUNC_DST_ALPHA:
    lVar1 = 0x50;
    do {
      if (*(char *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar1 + -0x54) ==
          '\x01') {
        *(undefined4 *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar1 + -4) =
             *(undefined4 *)
              ((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar1 + -0x24);
      }
      lVar1 = lVar1 + 0x84;
    } while (lVar1 != 0x2150);
    break;
  case BLENDFUNC_ONE_MINUS_DST_ALPHA:
    lVar1 = 0x50;
    do {
      if (*(char *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar1 + -0x54) ==
          '\x01') {
        *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar1 + -4) =
             1.0 - *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                             lVar1 + -0x24);
      }
      lVar1 = lVar1 + 0x84;
    } while (lVar1 != 0x2150);
    break;
  case BLENDFUNC_CONSTANT_COLOR:
    lVar1 = 0;
    do {
      if (*(char *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar1 + -4) ==
          '\x01') {
        *(float *)((long)this->m_sampleRegister[0].blendedRGB.m_data + lVar1 + -4) =
             blendColor->m_data[3];
      }
      lVar1 = lVar1 + 0x84;
    } while (lVar1 != 0x2100);
    break;
  case BLENDFUNC_ONE_MINUS_CONSTANT_COLOR:
    lVar1 = 0;
    do {
      if (*(char *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar1 + -4) ==
          '\x01') {
        *(float *)((long)this->m_sampleRegister[0].blendedRGB.m_data + lVar1 + -4) =
             1.0 - blendColor->m_data[3];
      }
      lVar1 = lVar1 + 0x84;
    } while (lVar1 != 0x2100);
    break;
  case BLENDFUNC_CONSTANT_ALPHA:
    lVar1 = 0;
    do {
      if (*(char *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar1 + -4) ==
          '\x01') {
        *(float *)((long)this->m_sampleRegister[0].blendedRGB.m_data + lVar1 + -4) =
             blendColor->m_data[3];
      }
      lVar1 = lVar1 + 0x84;
    } while (lVar1 != 0x2100);
    break;
  case BLENDFUNC_ONE_MINUS_CONSTANT_ALPHA:
    lVar1 = 0;
    do {
      if (*(char *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar1 + -4) ==
          '\x01') {
        *(float *)((long)this->m_sampleRegister[0].blendedRGB.m_data + lVar1 + -4) =
             1.0 - blendColor->m_data[3];
      }
      lVar1 = lVar1 + 0x84;
    } while (lVar1 != 0x2100);
    break;
  case BLENDFUNC_SRC_ALPHA_SATURATE:
    lVar1 = 0;
    do {
      if (*(char *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar1 + -4) ==
          '\x01') {
        *(undefined4 *)((long)this->m_sampleRegister[0].blendedRGB.m_data + lVar1 + -4) = 0x3f800000
        ;
      }
      lVar1 = lVar1 + 0x84;
    } while (lVar1 != 0x2100);
    break;
  case BLENDFUNC_SRC1_COLOR:
    lVar1 = 0;
    do {
      if (*(char *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar1 + -4) ==
          '\x01') {
        *(undefined4 *)((long)this->m_sampleRegister[0].blendedRGB.m_data + lVar1 + -4) =
             *(undefined4 *)
              ((long)this->m_sampleRegister[0].clampedBlendSrc1Color.m_data + lVar1 + 0xc);
      }
      lVar1 = lVar1 + 0x84;
    } while (lVar1 != 0x2100);
    break;
  case BLENDFUNC_ONE_MINUS_SRC1_COLOR:
    lVar1 = 0;
    do {
      if (*(char *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar1 + -4) ==
          '\x01') {
        *(float *)((long)this->m_sampleRegister[0].blendedRGB.m_data + lVar1 + -4) =
             1.0 - *(float *)((long)this->m_sampleRegister[0].clampedBlendSrc1Color.m_data +
                             lVar1 + 0xc);
      }
      lVar1 = lVar1 + 0x84;
    } while (lVar1 != 0x2100);
    break;
  case BLENDFUNC_SRC1_ALPHA:
    lVar1 = 0;
    do {
      if (*(char *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar1 + -4) ==
          '\x01') {
        *(undefined4 *)((long)this->m_sampleRegister[0].blendedRGB.m_data + lVar1 + -4) =
             *(undefined4 *)
              ((long)this->m_sampleRegister[0].clampedBlendSrc1Color.m_data + lVar1 + 0xc);
      }
      lVar1 = lVar1 + 0x84;
    } while (lVar1 != 0x2100);
    break;
  case BLENDFUNC_ONE_MINUS_SRC1_ALPHA:
    lVar1 = 0;
    do {
      if (*(char *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar1 + -4) ==
          '\x01') {
        *(float *)((long)this->m_sampleRegister[0].blendedRGB.m_data + lVar1 + -4) =
             1.0 - *(float *)((long)this->m_sampleRegister[0].clampedBlendSrc1Color.m_data +
                             lVar1 + 0xc);
      }
      lVar1 = lVar1 + 0x84;
    } while (lVar1 != 0x2100);
  }
  return;
}

Assistant:

void FragmentProcessor::executeBlendFactorComputeA (const Vec4& blendColor, const BlendState& blendAState)
{
#define SAMPLE_REGISTER_BLEND_FACTOR(FACTOR_NAME, FACTOR_EXPRESSION)														\
	for (int regSampleNdx = 0; regSampleNdx < SAMPLE_REGISTER_SIZE; regSampleNdx++)											\
	{																														\
		if (m_sampleRegister[regSampleNdx].isAlive)																			\
		{																													\
			const Vec4& src		= m_sampleRegister[regSampleNdx].clampedBlendSrcColor;										\
			const Vec4& src1	= m_sampleRegister[regSampleNdx].clampedBlendSrc1Color;										\
			const Vec4& dst		= m_sampleRegister[regSampleNdx].clampedBlendDstColor;										\
			DE_UNREF(src);																									\
			DE_UNREF(src1);																									\
			DE_UNREF(dst);																									\
																															\
			m_sampleRegister[regSampleNdx].FACTOR_NAME = (FACTOR_EXPRESSION);												\
		}																													\
	}

#define SWITCH_SRC_OR_DST_FACTOR_A(FUNC_NAME, FACTOR_NAME)																		\
	switch (blendAState.FUNC_NAME)																								\
	{																															\
		case BLENDFUNC_ZERO:						SAMPLE_REGISTER_BLEND_FACTOR(FACTOR_NAME, 0.0f)						break;	\
		case BLENDFUNC_ONE:							SAMPLE_REGISTER_BLEND_FACTOR(FACTOR_NAME, 1.0f)						break;	\
		case BLENDFUNC_SRC_COLOR:					SAMPLE_REGISTER_BLEND_FACTOR(FACTOR_NAME, src.w())					break;	\
		case BLENDFUNC_ONE_MINUS_SRC_COLOR:			SAMPLE_REGISTER_BLEND_FACTOR(FACTOR_NAME, 1.0f - src.w())			break;	\
		case BLENDFUNC_DST_COLOR:					SAMPLE_REGISTER_BLEND_FACTOR(FACTOR_NAME, dst.w())					break;	\
		case BLENDFUNC_ONE_MINUS_DST_COLOR:			SAMPLE_REGISTER_BLEND_FACTOR(FACTOR_NAME, 1.0f - dst.w())			break;	\
		case BLENDFUNC_SRC_ALPHA:					SAMPLE_REGISTER_BLEND_FACTOR(FACTOR_NAME, src.w())					break;	\
		case BLENDFUNC_ONE_MINUS_SRC_ALPHA:			SAMPLE_REGISTER_BLEND_FACTOR(FACTOR_NAME, 1.0f - src.w())			break;	\
		case BLENDFUNC_DST_ALPHA:					SAMPLE_REGISTER_BLEND_FACTOR(FACTOR_NAME, dst.w())					break;	\
		case BLENDFUNC_ONE_MINUS_DST_ALPHA:			SAMPLE_REGISTER_BLEND_FACTOR(FACTOR_NAME, 1.0f - dst.w())			break;	\
		case BLENDFUNC_CONSTANT_COLOR:				SAMPLE_REGISTER_BLEND_FACTOR(FACTOR_NAME, blendColor.w())			break;	\
		case BLENDFUNC_ONE_MINUS_CONSTANT_COLOR:	SAMPLE_REGISTER_BLEND_FACTOR(FACTOR_NAME, 1.0f - blendColor.w())	break;	\
		case BLENDFUNC_CONSTANT_ALPHA:				SAMPLE_REGISTER_BLEND_FACTOR(FACTOR_NAME, blendColor.w())			break;	\
		case BLENDFUNC_ONE_MINUS_CONSTANT_ALPHA:	SAMPLE_REGISTER_BLEND_FACTOR(FACTOR_NAME, 1.0f - blendColor.w())	break;	\
		case BLENDFUNC_SRC_ALPHA_SATURATE:			SAMPLE_REGISTER_BLEND_FACTOR(FACTOR_NAME, 1.0f)						break;	\
		case BLENDFUNC_SRC1_COLOR:					SAMPLE_REGISTER_BLEND_FACTOR(FACTOR_NAME, src1.w())					break;	\
		case BLENDFUNC_ONE_MINUS_SRC1_COLOR:		SAMPLE_REGISTER_BLEND_FACTOR(FACTOR_NAME, 1.0f - src1.w())			break;	\
		case BLENDFUNC_SRC1_ALPHA:					SAMPLE_REGISTER_BLEND_FACTOR(FACTOR_NAME, src1.w())					break;	\
		case BLENDFUNC_ONE_MINUS_SRC1_ALPHA:		SAMPLE_REGISTER_BLEND_FACTOR(FACTOR_NAME, 1.0f - src1.w())			break;	\
		default:																												\
			DE_ASSERT(false);																									\
	}

	SWITCH_SRC_OR_DST_FACTOR_A(srcFunc, blendSrcFactorA)
	SWITCH_SRC_OR_DST_FACTOR_A(dstFunc, blendDstFactorA)

#undef SWITCH_SRC_OR_DST_FACTOR_A
#undef SAMPLE_REGISTER_BLEND_FACTOR
}